

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O1

void __thiscall
TPZFYsmpMatrix<double>::AddKelOld
          (TPZFYsmpMatrix<double> *this,TPZFMatrix<double> *elmat,TPZVec<int> *destinationindex)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  double *pdVar4;
  const_iterator __pos;
  _Base_ptr p_Var5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  long lVar8;
  long *plVar9;
  long lVar10;
  long *plVar11;
  _Self __tmp;
  _Self __tmp_1;
  long lVar12;
  multimap<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> mapindex;
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  local_80;
  TPZVec<int> *local_50;
  long local_48;
  pair<long,_long> local_40;
  
  lVar1 = destinationindex->fNElements;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < lVar1) {
    lVar12 = 0;
    __pos._M_node = &local_80._M_impl.super__Rb_tree_header._M_header;
    do {
      local_40.first = (long)destinationindex->fStore[lVar12];
      local_40.second = lVar12;
      __pos._M_node =
           (_Base_ptr)
           std::
           _Rb_tree<long,std::pair<long_const,long>,std::_Select1st<std::pair<long_const,long>>,std::less<long>,std::allocator<std::pair<long_const,long>>>
           ::_M_emplace_hint_equal<std::pair<long,long>>
                     ((_Rb_tree<long,std::pair<long_const,long>,std::_Select1st<std::pair<long_const,long>>,std::less<long>,std::allocator<std::pair<long_const,long>>>
                       *)&local_80,__pos,&local_40);
      lVar12 = lVar12 + 1;
    } while (lVar1 != lVar12);
  }
  if (0 < lVar1) {
    lVar12 = 0;
    local_50 = destinationindex;
    do {
      plVar2 = (this->fIA).fStore;
      plVar11 = (this->fJA).fStore;
      lVar10 = plVar2[destinationindex->fStore[lVar12]];
      lVar8 = plVar2[(long)destinationindex->fStore[lVar12] + 1];
      plVar2 = plVar11 + lVar8;
      if (lVar10 == lVar8) {
        lVar8 = 0;
      }
      else {
        plVar11 = plVar11 + lVar10;
        lVar8 = 0;
        p_Var7 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          lVar3 = *plVar11;
          if (lVar3 == *(long *)(p_Var7 + 1)) {
            p_Var5 = p_Var7[1]._M_parent;
            if ((((elmat->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar12) ||
                ((long)p_Var5 < 0)) ||
               ((elmat->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)p_Var5)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar4 = (this->fA).fStore;
            pdVar4[lVar10] =
                 elmat->fElem
                 [(elmat->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * (long)p_Var5 + lVar12]
                 + pdVar4[lVar10];
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
            if (((_Rb_tree_header *)p_Var7 != &local_80._M_impl.super__Rb_tree_header) &&
               (p_Var7[1]._M_parent != p_Var5)) {
              plVar11 = plVar11 + 1;
              lVar10 = lVar10 + 1;
            }
            lVar8 = lVar8 + 1;
          }
          else if (lVar3 < *(long *)(p_Var7 + 1)) {
            plVar11 = plVar11 + 1;
            lVar10 = lVar10 + 1;
          }
          else if ((long)p_Var7[1]._M_parent < lVar3) {
            local_48 = lVar8;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "virtual void TPZFYsmpMatrix<double>::AddKelOld(TPZFMatrix<TVar> &, TPZVec<int> &) [TVar = double]"
                       ,0x61);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout," inconsistent\n",0xe);
            for (plVar9 = (this->fJA).fStore + lVar10; plVar9 < plVar2; plVar9 = plVar9 + 1) {
              poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
            for (p_Var5 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var5 != &local_80._M_impl.super__Rb_tree_header;
                p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
              poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
              poVar6 = std::ostream::_M_insert<long>((long)poVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            lVar8 = local_48;
            std::ostream::put(-0x58);
            std::ostream::flush();
          }
        } while ((lVar8 < lVar1) && (plVar11 != plVar2));
      }
      destinationindex = local_50;
      if (lVar8 != lVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "virtual void TPZFYsmpMatrix<double>::AddKelOld(TPZFMatrix<TVar> &, TPZVec<int> &) [TVar = double]"
                   ,0x61);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," inconsistent2 j = ",0x13);
        poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," nel ",5);
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        for (plVar11 = (this->fJA).fStore + lVar10; plVar11 < plVar2; plVar11 = plVar11 + 1) {
          poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        for (p_Var7 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != &local_80._M_impl.super__Rb_tree_header;
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
          poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
          poVar6 = std::ostream::_M_insert<long>((long)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar1);
  }
  std::
  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::AddKelOld(TPZFMatrix<TVar> & elmat, TPZVec < int > & destinationindex){
	int64_t i=0;
	int64_t j=0;
	int64_t ilocal=0;
	//  int jlocal=0;
	int64_t nel = destinationindex.NElements();
	std::multimap<int64_t,int64_t> mapindex;
	std::multimap<int64_t,int64_t>::iterator hint = mapindex.begin();
	for(i=0;i<nel;i++){
		ilocal = destinationindex[i];
		hint = mapindex.insert(hint,std::make_pair(ilocal,i));
		//    mapindex[ilocal] = i;
	}
	for(i=0;i<nel;i++){
		ilocal = destinationindex[i];
		int64_t jfirst = fIA[ilocal];
		int64_t jlast = fIA[ilocal+1];
		int64_t *Aptr = &fJA[jfirst];
		int64_t *AptrLast = &fJA[jlast];
		j=0;
		std::multimap<int64_t,int64_t>::iterator itelmat = mapindex.begin();
		while(j<nel && Aptr != AptrLast)
		{
			if(*Aptr == (*itelmat).first)
			{
				int64_t jel = (*itelmat).second;
				fA[jfirst] += elmat(i,jel);
				itelmat++;
				if(itelmat != mapindex.end() && (*itelmat).second != jel)
				{
					Aptr++;
					jfirst++;
				}
				j++;
			}
			else if(*Aptr < (*itelmat).first)
			{
				Aptr++;
				jfirst++;
			}
			else if(*Aptr > (*itelmat).second)
			{
				std::cout << __PRETTY_FUNCTION__ << " inconsistent\n";
				int64_t *iptr = &fJA[jfirst];
				while(iptr < AptrLast) 
				{
					cout << *iptr << " ";
					iptr++;
				}
				cout << endl;
				std::multimap<int64_t,int64_t>::iterator itelmat2 = mapindex.begin();
				for(;itelmat2 != mapindex.end(); itelmat2++)
				{
					cout << (*itelmat2).first << "/" << (*itelmat2).second << " ";
				}
				cout << endl;
				
			}
		}
		if(j!= nel)
		{
			std::cout << __PRETTY_FUNCTION__ << " inconsistent2 j = " << j << " nel " << nel << "\n";
			int64_t *iptr = &fJA[jfirst];
			while(iptr < AptrLast) 
			{
				cout << *iptr << " ";
				iptr++;
			}
			cout << endl;
			std::multimap<int64_t,int64_t>::iterator itelmat2 = mapindex.begin();
			for(;itelmat2 != mapindex.end(); itelmat2++)
			{
				cout << (*itelmat2).first << "/" << (*itelmat2).second << " ";
			}
			cout << endl;
		}
	}
	
}